

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayCommI.H
# Opt level: O2

void __thiscall
amrex::FabArray<amrex::CutFab>::ParallelCopy_nowait
          (FabArray<amrex::CutFab> *this,FabArray<amrex::CutFab> *src,int scomp,int dcomp,int ncomp,
          IntVect *snghost,IntVect *dnghost,Periodicity *period,CpOp op,CPC *a_cpc,
          bool to_ghost_cells_only)

{
  BoxArray *rhs;
  element_type *peVar1;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *pvVar2;
  bool bVar3;
  IndexType IVar4;
  int iVar5;
  undefined1 auVar6 [16];
  IntVect local_3c;
  
  peVar1 = (this->super_FabArrayBase).boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((int)(((long)*(pointer *)
                     ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data + 8) -
             *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data) / 0x1c) != 0) &&
     (peVar1 = (src->super_FabArrayBase).boxarray.m_ref.
               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     (int)(((long)*(pointer *)
                   ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data + 8) -
           *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data) / 0x1c) != 0)) {
    (this->super_FabArrayBase).n_filled.vect[2] = dnghost->vect[2];
    *(undefined8 *)(this->super_FabArrayBase).n_filled.vect = *(undefined8 *)dnghost->vect;
    rhs = &(src->super_FabArrayBase).boxarray;
    iVar5 = dcomp;
    IVar4 = BATransformer::index_type(&rhs->m_bat);
    if (((op == COPY) || (IVar4.itype == 0)) &&
       (bVar3 = BoxArray::operator==(&(this->super_FabArrayBase).boxarray,rhs), bVar3)) {
      bVar3 = DistributionMapping::operator==
                        (&(this->super_FabArrayBase).distributionMap,
                         &(src->super_FabArrayBase).distributionMap);
      auVar6._0_4_ = -(uint)((int)*(undefined8 *)(snghost->vect + 1) == 0);
      auVar6._4_4_ = -(uint)((int)((ulong)*(undefined8 *)(snghost->vect + 1) >> 0x20) == 0);
      auVar6._8_4_ = -(uint)((int)*(undefined8 *)dnghost->vect == 0);
      auVar6._12_4_ = -(uint)((int)((ulong)*(undefined8 *)dnghost->vect >> 0x20) == 0);
      iVar5 = movmskps(iVar5,auVar6);
      if ((((iVar5 == 0xf) && (snghost->vect[0] == 0)) && (bVar3)) &&
         ((dnghost->vect[2] == 0 &&
          (bVar3 = Periodicity::isAnyPeriodic(period), !bVar3 && !to_ghost_cells_only)))) {
        if (this == src) {
          return;
        }
        if (op != COPY) {
          local_3c.vect[0] = 0;
          local_3c.vect[1] = 0;
          local_3c.vect[2] = 0;
          Add<amrex::CutFab,void>(this,src,scomp,dcomp,ncomp,&local_3c);
          return;
        }
        local_3c.vect[0] = 0;
        local_3c.vect[1] = 0;
        local_3c.vect[2] = 0;
        Copy<amrex::CutFab,void>(this,src,scomp,dcomp,ncomp,&local_3c);
        return;
      }
    }
    if (a_cpc == (CPC *)0x0) {
      a_cpc = FabArrayBase::getCPC
                        (&this->super_FabArrayBase,dnghost,&src->super_FabArrayBase,snghost,period,
                         to_ghost_cells_only);
    }
    if ((*(int *)(DAT_006e0650 + -0x38) == 1) &&
       (pvVar2 = (a_cpc->super_CommMetaData).m_LocTags._M_t.
                 super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                 ._M_head_impl,
       (int)((ulong)((long)*(pointer *)
                            ((long)&(pvVar2->
                                    super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                    )._M_impl + 8) -
                    *(long *)&(pvVar2->
                              super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                              )._M_impl) >> 6) != 0)) {
      PC_local_cpu(this,a_cpc,src,scomp,dcomp,ncomp,op);
    }
  }
  return;
}

Assistant:

void
FabArray<FAB>::ParallelCopy_nowait (const FabArray<FAB>& src,
                                    int                  scomp,
                                    int                  dcomp,
                                    int                  ncomp,
                                    const IntVect&       snghost,
                                    const IntVect&       dnghost,
                                    const Periodicity&   period,
                                    CpOp                 op,
                                    const FabArrayBase::CPC * a_cpc,
                                    bool                 to_ghost_cells_only)
{
    BL_PROFILE_SYNC_START_TIMED("SyncBeforeComms: PC");
    BL_PROFILE("FabArray::ParallelCopy_nowait()");

    AMREX_ASSERT_WITH_MESSAGE(!pcd, "ParallelCopy_nowait() called when comm operation already in progress.");

    if (size() == 0 || src.size() == 0) {
        return;
    }

    BL_ASSERT(op == FabArrayBase::COPY || op == FabArrayBase::ADD);
    BL_ASSERT(boxArray().ixType() == src.boxArray().ixType());
    BL_ASSERT(src.nGrowVect().allGE(snghost));
    BL_ASSERT(    nGrowVect().allGE(dnghost));

    n_filled = dnghost;

    if ((src.boxArray().ixType().cellCentered() || op == FabArrayBase::COPY) &&
        (boxarray == src.boxarray && distributionMap == src.distributionMap) &&
        snghost == IntVect::TheZeroVector() &&
        dnghost == IntVect::TheZeroVector() &&
        !period.isAnyPeriodic() && !to_ghost_cells_only)
    {
        //
        // Short-circuit full intersection code if we're doing copy()s or if
        // we're doing plus()s on cell-centered data.  Don't do plus()s on
        // non-cell-centered data this simplistic way.
        //
        if (this != &src) { // avoid self copy or plus
            if (op == FabArrayBase::COPY) {
                Copy(*this, src, scomp, dcomp, ncomp, IntVect(0));
            } else {
                Add(*this, src, scomp, dcomp, ncomp, IntVect(0));
            }
        }
        return;
    }

    const CPC& thecpc = (a_cpc) ? *a_cpc : getCPC(dnghost, src, snghost, period, to_ghost_cells_only);

    if (ParallelContext::NProcsSub() == 1)
    {
        //
        // There can only be local work to do.
        //

        int N_locs = (*thecpc.m_LocTags).size();
        if (N_locs == 0) { return; }
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion())
        {
            PC_local_gpu(thecpc, src, scomp, dcomp, ncomp, op);
        }
        else
#endif
        {
            PC_local_cpu(thecpc, src, scomp, dcomp, ncomp, op);
        }

        return;
    }

#ifdef BL_USE_MPI

    //
    // Do this before prematurely exiting if running in parallel.
    // Otherwise sequence numbers will not match across MPI processes.
    //
    int tag = ParallelDescriptor::SeqNum();

    const int N_snds = thecpc.m_SndTags->size();
    const int N_rcvs = thecpc.m_RcvTags->size();
    const int N_locs = thecpc.m_LocTags->size();

    if (N_locs == 0 && N_rcvs == 0 && N_snds == 0) {
        //
        // No work to do.
        //

        return;
    }

    //
    // Send/Recv at most MaxComp components at a time to cut down memory usage.
    //
    int NCompLeft = ncomp;
    int SC = scomp, DC = dcomp, NC;

    for (int ipass = 0; ipass < ncomp; )
    {
        pcd = std::make_unique<PCData<FAB>>();
        pcd->cpc = &thecpc;
        pcd->src = &src;
        pcd->op = op;
        pcd->tag = tag;

        NC = std::min(NCompLeft,FabArrayBase::MaxComp);
        const bool last_iter = (NCompLeft == NC);

        pcd->SC = SC;
        pcd->DC = DC;
        pcd->NC = NC;

        //
        // Post rcvs. Allocate one chunk of space to hold'm all.
        //
        pcd->the_recv_data = nullptr;

        pcd->actual_n_rcvs = 0;
        if (N_rcvs > 0) {
            PostRcvs(*thecpc.m_RcvTags, pcd->the_recv_data,
                     pcd->recv_data, pcd->recv_size, pcd->recv_from, pcd->recv_reqs, NC, pcd->tag);
            pcd->actual_n_rcvs = N_rcvs - std::count(pcd->recv_size.begin(), pcd->recv_size.end(), 0);
        }

        //
        // Post send's
        //
        Vector<char*>                       send_data;
        Vector<std::size_t>                 send_size;
        Vector<int>                         send_rank;
        Vector<const CopyComTagsContainer*> send_cctc;

        if (N_snds > 0)
        {
            src.PrepareSendBuffers(*thecpc.m_SndTags, pcd->the_send_data, send_data, send_size,
                                   send_rank, pcd->send_reqs, send_cctc, NC);

#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion())
            {
                pack_send_buffer_gpu(src, SC, NC, send_data, send_size, send_cctc);
            }
            else
#endif
            {
                pack_send_buffer_cpu(src, SC, NC, send_data, send_size, send_cctc);
            }

            AMREX_ASSERT(pcd->send_reqs.size() == N_snds);
            FabArray<FAB>::PostSnds(send_data, send_size, send_rank, pcd->send_reqs, pcd->tag);
        }

        //
        // Do the local work.  Hope for a bit of communication/computation overlap.
        //
        if (N_locs > 0)
        {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion())
            {
                PC_local_gpu(thecpc, src, SC, DC, NC, op);
            }
            else
#endif
            {
                PC_local_cpu(thecpc, src, SC, DC, NC, op);
            }
        }

        if (!last_iter)
        {
            ParallelCopy_finish();

            SC += NC;
            DC += NC;
        }

        ipass     += NC;
        NCompLeft -= NC;
    }

#endif /*BL_USE_MPI*/
}